

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rtreeCheckMapping(RtreeCheck *pCheck,int bLeaf,i64 iKey,i64 iVal)

{
  long lVar1;
  int iVar2;
  sqlite3_stmt *pStmt;
  sqlite3_int64 sVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  char *azSql [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  azSql[0] = "SELECT parentnode FROM %Q.\'%q_parent\' WHERE nodeno=?1";
  azSql[1] = "SELECT nodeno FROM %Q.\'%q_rowid\' WHERE rowid=?1";
  pStmt = pCheck->aCheckMapping[(uint)bLeaf];
  if (pStmt == (sqlite3_stmt *)0x0) {
    pStmt = rtreeCheckPrepare(pCheck,azSql[(uint)bLeaf],pCheck->zDb,pCheck->zTab);
    pCheck->aCheckMapping[(uint)bLeaf] = pStmt;
  }
  if (pCheck->rc == 0) {
    sqlite3_bind_int64(pStmt,1,iKey);
    iVar2 = sqlite3_step(pStmt);
    if (iVar2 == 100) {
      sVar3 = sqlite3_column_int64(pStmt,0);
      if (sVar3 != iVal) {
        pcVar4 = "%_rowid";
        if (bLeaf == 0) {
          pcVar4 = "%_parent";
        }
        rtreeCheckAppendMsg(pCheck,"Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",iKey,
                            sVar3,pcVar4,iKey,iVal);
      }
    }
    else if (iVar2 == 0x65) {
      pcVar4 = "%_rowid";
      if (bLeaf == 0) {
        pcVar4 = "%_parent";
      }
      rtreeCheckAppendMsg(pCheck,"Mapping (%lld -> %lld) missing from %s table",iKey,iVal,pcVar4);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      rtreeCheckReset(pCheck,pStmt);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void rtreeCheckMapping(
  RtreeCheck *pCheck,             /* RtreeCheck object */
  int bLeaf,                      /* True for a leaf cell, false for interior */
  i64 iKey,                       /* Key for mapping */
  i64 iVal                        /* Expected value for mapping */
){
  int rc;
  sqlite3_stmt *pStmt;
  const char *azSql[2] = {
    "SELECT parentnode FROM %Q.'%q_parent' WHERE nodeno=?1",
    "SELECT nodeno FROM %Q.'%q_rowid' WHERE rowid=?1"
  };

  assert( bLeaf==0 || bLeaf==1 );
  if( pCheck->aCheckMapping[bLeaf]==0 ){
    pCheck->aCheckMapping[bLeaf] = rtreeCheckPrepare(pCheck,
        azSql[bLeaf], pCheck->zDb, pCheck->zTab
    );
  }
  if( pCheck->rc!=SQLITE_OK ) return;

  pStmt = pCheck->aCheckMapping[bLeaf];
  sqlite3_bind_int64(pStmt, 1, iKey);
  rc = sqlite3_step(pStmt);
  if( rc==SQLITE_DONE ){
    rtreeCheckAppendMsg(pCheck, "Mapping (%lld -> %lld) missing from %s table",
        iKey, iVal, (bLeaf ? "%_rowid" : "%_parent")
    );
  }else if( rc==SQLITE_ROW ){
    i64 ii = sqlite3_column_int64(pStmt, 0);
    if( ii!=iVal ){
      rtreeCheckAppendMsg(pCheck,
          "Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",
          iKey, ii, (bLeaf ? "%_rowid" : "%_parent"), iKey, iVal
      );
    }
  }
  rtreeCheckReset(pCheck, pStmt);
}